

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  runtime_error *prVar3;
  string targetPath;
  string sourcePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  ifstream inSource;
  streambuf local_728 [504];
  stringstream sourceContent;
  ostream local_520 [376];
  ifstream inTarget;
  streambuf local_398 [504];
  stringstream targetContent;
  ostream local_190 [376];
  
  if (argc < 2) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Provide sufficient arguments");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&sourcePath,argv[1],(allocator *)&inSource);
  std::__cxx11::string::string((string *)&targetPath,argv[2],(allocator *)&inSource);
  json::JsonDocument::createFromFile((JsonDocument *)&inSource,&sourcePath);
  json::JsonDocument::saveToFile((JsonDocument *)&inSource,&targetPath,4);
  if (_inSource != (long *)0x0) {
    (**(code **)(*_inSource + 8))();
  }
  std::ifstream::ifstream(&inSource,(string *)&sourcePath,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inTarget,
                   "Could not open file: ",&sourcePath);
    std::runtime_error::runtime_error(prVar3,(string *)&inTarget);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(&inTarget,(string *)&targetPath,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &sourceContent,"Could not open file: ",&targetPath);
    std::runtime_error::runtime_error(prVar3,(string *)&sourceContent);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&sourceContent);
  std::__cxx11::stringstream::stringstream((stringstream *)&targetContent);
  std::ostream::operator<<(local_520,local_728);
  std::ostream::operator<<(local_190,local_398);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  bVar2 = std::operator!=(&local_778,&local_758);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_778);
  if (!bVar2) {
    std::ifstream::close();
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream((stringstream *)&targetContent);
    std::__cxx11::stringstream::~stringstream((stringstream *)&sourceContent);
    std::ifstream::~ifstream(&inTarget);
    std::ifstream::~ifstream(&inSource);
    std::__cxx11::string::~string((string *)&targetPath);
    std::__cxx11::string::~string((string *)&sourcePath);
    return 0;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"The two files were not equal");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char **argv)
{
    if (argc < 2)
        throw std::runtime_error("Provide sufficient arguments");

    // The file to parse.
    std::string sourcePath = argv[1];

    // The file we want to write to.
    std::string targetPath = argv[2];

    // Parse the source file and save it to the target file.
    JsonDocument::createFromFile(sourcePath).saveToFile(targetPath);

    std::ifstream inSource(sourcePath);

    if (!inSource.is_open())
        throw std::runtime_error("Could not open file: " + sourcePath);

    std::ifstream inTarget(targetPath);

    if (!inTarget.is_open())
        throw std::runtime_error("Could not open file: " + targetPath);

    std::stringstream sourceContent;
    std::stringstream targetContent;

    // Read the two files.
    sourceContent << inSource.rdbuf();
    targetContent << inTarget.rdbuf();

    // Compare the two files, if the parser works they should be equal.
    if (sourceContent.str() != targetContent.str())
        throw std::runtime_error("The two files were not equal");

    inSource.close();
    inTarget.close();
}